

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_iter_new(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  mz_bool mVar1;
  size_t sVar2;
  void *pvVar3;
  undefined8 local_d8;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_zip_reader_extract_iter_state *pState;
  mz_uint flags_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  if ((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) {
    pZip_local = (mz_zip_archive *)0x0;
  }
  else {
    local_header_u32._24_8_ = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x2570);
    if ((void *)local_header_u32._24_8_ == (void *)0x0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      pZip_local = (mz_zip_archive *)0x0;
    }
    else {
      mVar1 = mz_zip_reader_file_stat
                        (pZip,file_index,
                         (mz_zip_archive_file_stat *)(local_header_u32._24_8_ + 0x40));
      if (mVar1 == 0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
        pZip_local = (mz_zip_archive *)0x0;
      }
      else if ((*(ushort *)(local_header_u32._24_8_ + 0x54) & 0x61) == 0) {
        if ((((flags & 0x400) == 0) && (*(short *)(local_header_u32._24_8_ + 0x56) != 0)) &&
           (*(short *)(local_header_u32._24_8_ + 0x56) != 8)) {
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
          }
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
          pZip_local = (mz_zip_archive *)0x0;
        }
        else {
          *(mz_zip_archive **)local_header_u32._24_8_ = pZip;
          *(mz_uint *)(local_header_u32._24_8_ + 8) = flags;
          *(undefined4 *)(local_header_u32._24_8_ + 0xc) = 0;
          *(undefined4 *)(local_header_u32._24_8_ + 0x2568) = 0;
          *(undefined8 *)(local_header_u32._24_8_ + 0x18) = 0;
          *(undefined8 *)(local_header_u32._24_8_ + 0x30) = 0;
          *(undefined8 *)(local_header_u32._24_8_ + 0x498) = 0;
          *(undefined8 *)(local_header_u32._24_8_ + 0x4a0) = 0;
          *(undefined8 *)(local_header_u32._24_8_ + 0x4a8) = 0;
          *(undefined8 *)(local_header_u32._24_8_ + 0x38) =
               *(undefined8 *)(local_header_u32._24_8_ + 0x78);
          sVar2 = (*pZip->m_pRead)(pZip->m_pIO_opaque,*(mz_uint64 *)(local_header_u32._24_8_ + 0x38)
                                   ,&pLocal_header,0x1e);
          if (sVar2 == 0x1e) {
            if ((int)pLocal_header == 0x4034b50) {
              *(ulong *)(local_header_u32._24_8_ + 0x38) =
                   (ulong)local_header_u32[4]._2_2_ + 0x1e + (ulong)(ushort)local_header_u32[5] +
                   *(long *)(local_header_u32._24_8_ + 0x38);
              if (pZip->m_archive_size <
                  (ulong)(*(long *)(local_header_u32._24_8_ + 0x38) +
                         *(long *)(local_header_u32._24_8_ + 0x60))) {
                if (pZip != (mz_zip_archive *)0x0) {
                  pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
                (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
                pZip_local = (mz_zip_archive *)0x0;
              }
              else {
                if (pZip->m_pState->m_pMem == (void *)0x0) {
                  if (((flags & 0x400) == 0) && (*(short *)(local_header_u32._24_8_ + 0x56) != 0)) {
                    if (*(ulong *)(local_header_u32._24_8_ + 0x60) < 0x10000) {
                      local_d8 = *(undefined8 *)(local_header_u32._24_8_ + 0x60);
                    }
                    else {
                      local_d8 = 0x10000;
                    }
                    *(undefined8 *)(local_header_u32._24_8_ + 0x10) = local_d8;
                    pvVar3 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,
                                               *(size_t *)(local_header_u32._24_8_ + 0x10));
                    *(void **)(local_header_u32._24_8_ + 0x498) = pvVar3;
                    if (pvVar3 == (void *)0x0) {
                      if (pZip != (mz_zip_archive *)0x0) {
                        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                      }
                      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
                      return (mz_zip_reader_extract_iter_state *)0x0;
                    }
                  }
                  else {
                    *(undefined8 *)(local_header_u32._24_8_ + 0x10) = 0;
                  }
                  *(undefined8 *)(local_header_u32._24_8_ + 0x20) = 0;
                  *(undefined8 *)(local_header_u32._24_8_ + 0x28) =
                       *(undefined8 *)(local_header_u32._24_8_ + 0x60);
                }
                else {
                  *(long *)(local_header_u32._24_8_ + 0x498) =
                       (long)pZip->m_pState->m_pMem + *(long *)(local_header_u32._24_8_ + 0x38);
                  *(undefined8 *)(local_header_u32._24_8_ + 0x20) =
                       *(undefined8 *)(local_header_u32._24_8_ + 0x60);
                  *(undefined8 *)(local_header_u32._24_8_ + 0x10) =
                       *(undefined8 *)(local_header_u32._24_8_ + 0x60);
                  *(undefined8 *)(local_header_u32._24_8_ + 0x28) =
                       *(undefined8 *)(local_header_u32._24_8_ + 0x60);
                }
                if (((flags & 0x400) == 0) && (*(short *)(local_header_u32._24_8_ + 0x56) != 0)) {
                  *(undefined4 *)(local_header_u32._24_8_ + 0x4b0) = 0;
                  pvVar3 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
                  *(void **)(local_header_u32._24_8_ + 0x4a0) = pvVar3;
                  if (pvVar3 == (void *)0x0) {
                    if (pZip != (mz_zip_archive *)0x0) {
                      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    if (*(long *)(local_header_u32._24_8_ + 0x498) != 0) {
                      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,
                                       *(void **)(local_header_u32._24_8_ + 0x498));
                    }
                    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
                    return (mz_zip_reader_extract_iter_state *)0x0;
                  }
                }
                pZip_local = (mz_zip_archive *)local_header_u32._24_8_;
              }
            }
            else {
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              }
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
              pZip_local = (mz_zip_archive *)0x0;
            }
          }
          else {
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            }
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
            pZip_local = (mz_zip_archive *)0x0;
          }
        }
      }
      else {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
        pZip_local = (mz_zip_archive *)0x0;
      }
    }
  }
  return (mz_zip_reader_extract_iter_state *)pZip_local;
}

Assistant:

mz_zip_reader_extract_iter_state* mz_zip_reader_extract_iter_new(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_reader_extract_iter_state *pState;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

    /* Argument sanity check */
    if ((!pZip) || (!pZip->m_pState))
        return NULL;

    /* Allocate an iterator status structure */
    pState = (mz_zip_reader_extract_iter_state*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_reader_extract_iter_state));
    if (!pState)
    {
        mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        return NULL;
    }

    /* Fetch file details */
    if (!mz_zip_reader_file_stat(pZip, file_index, &pState->file_stat))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
    }

    /* Encryption and patch files are not supported. */
    if (pState->file_stat.m_bit_flag & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
    {
        mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
    }

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (pState->file_stat.m_method != 0) && (pState->file_stat.m_method != MZ_DEFLATED))
    {
        mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
    }

    /* Init state - save args */
    pState->pZip = pZip;
    pState->flags = flags;

    /* Init state - reset variables to defaults */
    pState->status = TINFL_STATUS_DONE;
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    pState->file_crc32 = MZ_CRC32_INIT;
#endif
    pState->read_buf_ofs = 0;
    pState->out_buf_ofs = 0;
    pState->pRead_buf = NULL;
    pState->pWrite_buf = NULL;
    pState->out_blk_remain = 0;

    /* Read and parse the local directory entry. */
    pState->cur_file_ofs = pState->file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, pState->cur_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    {
        mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
    }

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
    }

    pState->cur_file_ofs += (mz_uint64)(MZ_ZIP_LOCAL_DIR_HEADER_SIZE) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((pState->cur_file_ofs + pState->file_stat.m_comp_size) > pZip->m_archive_size)
    {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
    }

    /* Decompress the file either directly from memory or from a file input buffer. */
    if (pZip->m_pState->m_pMem)
    {
        pState->pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + pState->cur_file_ofs;
        pState->read_buf_size = pState->read_buf_avail = pState->file_stat.m_comp_size;
        pState->comp_remaining = pState->file_stat.m_comp_size;
    }
    else
    {
        if (!((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!pState->file_stat.m_method)))
        {
            /* Decompression required, therefore intermediate read buffer required */
            pState->read_buf_size = MZ_MIN(pState->file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
            if (NULL == (pState->pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)pState->read_buf_size)))
            {
                mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
                pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
                return NULL;
            }
        }
        else
        {
            /* Decompression not required - we will be reading directly into user buffer, no temp buf required */
            pState->read_buf_size = 0;
        }
        pState->read_buf_avail = 0;
        pState->comp_remaining = pState->file_stat.m_comp_size;
    }

    if (!((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!pState->file_stat.m_method)))
    {
        /* Decompression required, init decompressor */
        tinfl_init( &pState->inflator );

        /* Allocate write buffer */
        if (NULL == (pState->pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, TINFL_LZ_DICT_SIZE)))
        {
            mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            if (pState->pRead_buf)
                pZip->m_pFree(pZip->m_pAlloc_opaque, pState->pRead_buf);
            pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
            return NULL;
        }
    }

    return pState;
}